

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[5]>(XmlWriter *this,string *name,char (*attribute) [5])

{
  XmlWriter *pXVar1;
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_48;
  
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::operator<<((ostream *)local_1c0,*attribute);
  std::__cxx11::stringbuf::str();
  pXVar1 = writeAttribute(this,name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }